

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetDeviceTwinCallback
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback,void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_RESULT IVar3;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar3 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar3 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetDeviceTwinCallback",0x976,1,
                "Invalid argument specified iothubClientHandle=%p",0);
    }
  }
  else {
    if (deviceTwinCallback == (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0) {
      (*iotHubClientHandle->IoTHubTransport_Unsubscribe_DeviceTwin)
                (iotHubClientHandle->transportHandle);
      iotHubClientHandle->deviceTwinCallback = (IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK)0x0;
    }
    else {
      iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceTwin)
                        (iotHubClientHandle->transportHandle);
      if (iVar1 != 0) {
        return IOTHUB_CLIENT_ERROR;
      }
      iotHubClientHandle->deviceTwinCallback = deviceTwinCallback;
      iotHubClientHandle->deviceTwinContextCallback = userContextCallback;
    }
    IVar3 = IOTHUB_CLIENT_OK;
  }
  return IVar3;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetDeviceTwinCallback(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_DEVICE_TWIN_CALLBACK deviceTwinCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;
    if (iotHubClientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("Invalid argument specified iothubClientHandle=%p", iotHubClientHandle);
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if (deviceTwinCallback == NULL)
        {
            handleData->IoTHubTransport_Unsubscribe_DeviceTwin(handleData->transportHandle);
            handleData->deviceTwinCallback = NULL;
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            if (handleData->IoTHubTransport_Subscribe_DeviceTwin(handleData->transportHandle) == 0)
            {
                handleData->deviceTwinCallback = deviceTwinCallback;
                handleData->deviceTwinContextCallback = userContextCallback;
                result = IOTHUB_CLIENT_OK;
            }
            else
            {
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }
    return result;
}